

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d4e6f::PerAEADTest_InvalidNonceLength_Test::TestBody
          (PerAEADTest_InvalidNonceLength_Test *this)

{
  undefined1 *this_00;
  size_type __n;
  bool bVar1;
  int iVar2;
  EVP_AEAD *pEVar3;
  ParamType *pPVar4;
  size_t sVar5;
  char *pcVar6;
  reference puVar7;
  evp_aead_ctx_st *peVar8;
  EVP_AEAD *pEVar9;
  uchar *puVar10;
  char *pcVar11;
  ulong uVar12;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_630;
  string local_608;
  AssertHelper local_5e8;
  Message local_5e0;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__5;
  AssertionResult local_5b8;
  string local_5a8;
  AssertHelper local_588;
  Message local_580;
  bool local_571;
  undefined1 local_570 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_540;
  Message local_538;
  int local_52c;
  undefined1 local_528 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4f8;
  Message local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__2;
  AssertionResult local_4c8;
  int local_4b4;
  undefined1 local_4b0 [4];
  uint32_t err;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_448;
  Message local_440;
  int local_434;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_;
  ScopedEVP_AEAD_CTX ctx;
  undefined1 local_1d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce;
  size_t len;
  uint8_t buf [256];
  unsigned_long uStack_b0;
  ScopedTrace gtest_trace_705;
  size_t nonce_len;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  AssertHelper local_88;
  Message local_80;
  unsigned_long local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  size_t ad_len;
  value_type_conflict2 local_50 [3];
  value_type_conflict2 local_38;
  undefined1 local_30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonce_lens;
  size_t valid_nonce_len;
  PerAEADTest_InvalidNonceLength_Test *this_local;
  
  pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
  nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)EVP_AEAD_nonce_length(pEVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  if (nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    local_38 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,&local_38);
  }
  pPVar4 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  if ((pPVar4->flags & 4) == 0) {
    local_50[0] = (long)nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,local_50);
    if (nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      ad_len = (long)nonce_lens.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage - 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,&ad_len);
    }
  }
  pPVar4 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  sVar5 = RequiredADLength(pPVar4->flags);
  if (sVar5 == 0) {
    local_630._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  }
  else {
    pPVar4 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
    local_630._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         RequiredADLength(pPVar4->flags);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_630._M_head_impl;
  local_78 = 0x50;
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)local_70,"ad_len","sizeof(kZeros)",(unsigned_long *)&gtest_ar.message_,
             &local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x2be,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (bVar1) {
    __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
    nonce_len = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30
                                  );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&nonce_len), bVar1) {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1);
      uStack_b0 = *puVar7;
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                ((ScopedTrace *)(buf + 0xff),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x2c1,&stack0xffffffffffffff50);
      __n = uStack_b0;
      this_00 = &ctx.ctx_.field_0x23f;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,__n,
                 (allocator_type *)this_00);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&ctx.ctx_.field_0x23f);
      bssl::internal::
      StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
      StackAllocated((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                      *)&gtest_ar_.message_);
      peVar8 = bssl::internal::
               StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::get
                         ((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                           *)&gtest_ar_.message_);
      pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
      pEVar9 = PerAEADTest::aead(&this->super_PerAEADTest);
      sVar5 = EVP_AEAD_key_length(pEVar9);
      pcVar6 = (char *)0x1;
      local_434 = EVP_AEAD_CTX_init_with_direction(peVar8,pEVar3,"",sVar5,0,evp_aead_seal);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_430,&local_434,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
      if (!bVar1) {
        testing::Message::Message(&local_440);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__1.message_,(internal *)local_430,
                   (AssertionResult *)
                   "EVP_AEAD_CTX_init_with_direction( ctx.get(), aead(), kZeros, EVP_AEAD_key_length(aead()), 0, evp_aead_seal)"
                   ,"false","true",pcVar6);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_448,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x2c8,pcVar6);
        testing::internal::AssertHelper::operator=(&local_448,&local_440);
        testing::internal::AssertHelper::~AssertHelper(&local_448);
        std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_440);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
      if (!bVar1) {
        peVar8 = bssl::internal::
                 StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
                 get((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                      *)&gtest_ar_.message_);
        puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
        pcVar6 = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_1d8);
        iVar2 = EVP_AEAD_CTX_seal(peVar8,(uint8_t *)&len,
                                  (size_t *)
                                  &nonce.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0x100,puVar10,
                                  (size_t)pcVar6,(uint8_t *)0x0,0,"",
                                  (size_t)gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
        local_479 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_478,&local_479,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
        if (!bVar1) {
          testing::Message::Message(&local_488);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_4b0,(internal *)local_478,
                     (AssertionResult *)
                     "EVP_AEAD_CTX_seal(ctx.get(), buf, &len, sizeof(buf), nonce.data(), nonce.size(), nullptr , 0, kZeros , ad_len)"
                     ,"true","false",pcVar6);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_490,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x2cc,pcVar11);
          testing::internal::AssertHelper::operator=(&local_490,&local_488);
          testing::internal::AssertHelper::~AssertHelper(&local_490);
          std::__cxx11::string::~string((string *)local_4b0);
          testing::Message::~Message(&local_488);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
        uVar12 = ERR_get_error();
        local_4b4 = (int)uVar12;
        ErrorEquals((int)&gtest_ar__2 + 8,local_4b4,0x1e);
        testing::AssertionResult::operator!(&local_4c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
        testing::AssertionResult::~AssertionResult(&local_4c8);
        testing::AssertionResult::~AssertionResult((AssertionResult *)&gtest_ar__2.message_);
        if (bVar1) {
          ErrorEquals((uint32_t)local_4e8,local_4b4,0x1e);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
          if (!bVar1) {
            testing::Message::Message(&local_4f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__3.message_,(internal *)local_4e8,
                       (AssertionResult *)"ErrorEquals(err, ERR_LIB_CIPHER, 111)","false","true",
                       pcVar6);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_4f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                       ,0x2d1,pcVar6);
            testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
            testing::internal::AssertHelper::~AssertHelper(&local_4f8);
            std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
            testing::Message::~Message(&local_4f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
        }
        bssl::internal::
        StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::Reset
                  ((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                    *)&gtest_ar_.message_);
        peVar8 = bssl::internal::
                 StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
                 get((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                      *)&gtest_ar_.message_);
        pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
        pEVar9 = PerAEADTest::aead(&this->super_PerAEADTest);
        sVar5 = EVP_AEAD_key_length(pEVar9);
        pcVar6 = (char *)0x0;
        local_52c = EVP_AEAD_CTX_init_with_direction(peVar8,pEVar3,"",sVar5,0,evp_aead_open);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_528,&local_52c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
        if (!bVar1) {
          testing::Message::Message(&local_538);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_528,
                     (AssertionResult *)
                     "EVP_AEAD_CTX_init_with_direction( ctx.get(), aead(), kZeros, EVP_AEAD_key_length(aead()), 0, evp_aead_open)"
                     ,"false","true",pcVar6);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_540,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x2d7,pcVar6);
          testing::internal::AssertHelper::operator=(&local_540,&local_538);
          testing::internal::AssertHelper::~AssertHelper(&local_540);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_538);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
        if (!bVar1) {
          peVar8 = bssl::internal::
                   StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                   ::get((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                          *)&gtest_ar_.message_);
          puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
          pcVar6 = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_1d8);
          iVar2 = EVP_AEAD_CTX_open(peVar8,(uint8_t *)&len,
                                    (size_t *)
                                    &nonce.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0x100,
                                    puVar10,(size_t)pcVar6,"",0x50,"",
                                    (size_t)gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
          local_571 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_570,&local_571,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
          if (!bVar1) {
            testing::Message::Message(&local_580);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_5a8,(internal *)local_570,
                       (AssertionResult *)
                       "EVP_AEAD_CTX_open(ctx.get(), buf, &len, sizeof(buf), nonce.data(), nonce.size(), kZeros , sizeof(kZeros), kZeros , ad_len)"
                       ,"true","false",pcVar6);
            pcVar11 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_588,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                       ,0x2da,pcVar11);
            testing::internal::AssertHelper::operator=(&local_588,&local_580);
            testing::internal::AssertHelper::~AssertHelper(&local_588);
            std::__cxx11::string::~string((string *)&local_5a8);
            testing::Message::~Message(&local_580);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
          uVar12 = ERR_get_error();
          local_4b4 = (int)uVar12;
          ErrorEquals((int)&gtest_ar__5 + 8,local_4b4,0x1e);
          testing::AssertionResult::operator!(&local_5b8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b8);
          testing::AssertionResult::~AssertionResult(&local_5b8);
          testing::AssertionResult::~AssertionResult((AssertionResult *)&gtest_ar__5.message_);
          if (bVar1) {
            ErrorEquals((uint32_t)local_5d8,local_4b4,0x1e);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
            if (!bVar1) {
              testing::Message::Message(&local_5e0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_608,(internal *)local_5d8,
                         (AssertionResult *)"ErrorEquals(err, ERR_LIB_CIPHER, 111)","false","true",
                         pcVar6);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_5e8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                         ,0x2de,pcVar6);
              testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
              testing::internal::AssertHelper::~AssertHelper(&local_5e8);
              std::__cxx11::string::~string((string *)&local_608);
              testing::Message::~Message(&local_5e0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
          }
          bVar1 = false;
        }
      }
      bssl::internal::
      StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
      ~StackAllocated((StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
                       *)&gtest_ar_.message_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(buf + 0xff));
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  return;
}

Assistant:

TEST_P(PerAEADTest, InvalidNonceLength) {
  size_t valid_nonce_len = EVP_AEAD_nonce_length(aead());
  std::vector<size_t> nonce_lens;
  if (valid_nonce_len != 0) {
    // Other than the implicit IV TLS "AEAD"s, none of our AEADs allow empty
    // nonces. In particular, although AES-GCM was incorrectly specified with
    // variable-length nonces, it does not allow the empty nonce.
    nonce_lens.push_back(0);
  }
  if (!(GetParam().flags & kVariableNonce)) {
    nonce_lens.push_back(valid_nonce_len + 1);
    if (valid_nonce_len != 0) {
      nonce_lens.push_back(valid_nonce_len - 1);
    }
  }

  static const uint8_t kZeros[EVP_AEAD_MAX_KEY_LENGTH] = {0};
  const size_t ad_len = RequiredADLength(GetParam().flags) != 0
                            ? RequiredADLength(GetParam().flags)
                            : 16;
  ASSERT_LE(ad_len, sizeof(kZeros));

  for (size_t nonce_len : nonce_lens) {
    SCOPED_TRACE(nonce_len);
    uint8_t buf[256];
    size_t len;
    std::vector<uint8_t> nonce(nonce_len);
    bssl::ScopedEVP_AEAD_CTX ctx;
    ASSERT_TRUE(EVP_AEAD_CTX_init_with_direction(
        ctx.get(), aead(), kZeros, EVP_AEAD_key_length(aead()),
        EVP_AEAD_DEFAULT_TAG_LENGTH, evp_aead_seal));

    EXPECT_FALSE(EVP_AEAD_CTX_seal(ctx.get(), buf, &len, sizeof(buf),
                                   nonce.data(), nonce.size(), nullptr /* in */,
                                   0, kZeros /* ad */, ad_len));
    uint32_t err = ERR_get_error();
    // TODO(davidben): Merge these errors. https://crbug.com/boringssl/129.
    if (!ErrorEquals(err, ERR_LIB_CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE)) {
      EXPECT_TRUE(
          ErrorEquals(err, ERR_LIB_CIPHER, CIPHER_R_INVALID_NONCE_SIZE));
    }

    ctx.Reset();
    ASSERT_TRUE(EVP_AEAD_CTX_init_with_direction(
        ctx.get(), aead(), kZeros, EVP_AEAD_key_length(aead()),
        EVP_AEAD_DEFAULT_TAG_LENGTH, evp_aead_open));
    EXPECT_FALSE(EVP_AEAD_CTX_open(ctx.get(), buf, &len, sizeof(buf),
                                   nonce.data(), nonce.size(), kZeros /* in */,
                                   sizeof(kZeros), kZeros /* ad */, ad_len));
    err = ERR_get_error();
    if (!ErrorEquals(err, ERR_LIB_CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE)) {
      EXPECT_TRUE(
          ErrorEquals(err, ERR_LIB_CIPHER, CIPHER_R_INVALID_NONCE_SIZE));
    }
  }
}